

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vcf.c
# Opt level: O1

void bcf_set_variant_types(bcf1_t *b)

{
  int *piVar1;
  char cVar2;
  char **ppcVar3;
  char *pcVar4;
  variant_t *pvVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  char *pcVar10;
  long lVar11;
  long lVar12;
  char *pcVar13;
  char *pcVar14;
  char *pcVar15;
  char *pcVar16;
  char *pcVar17;
  bool bVar18;
  
  if ((b->unpacked & 1) == 0) {
    bcf_unpack(b,1);
  }
  uVar6 = *(uint *)&b->field_0x10 >> 0x10;
  if ((b->d).n_var < (int)uVar6) {
    pvVar5 = (variant_t *)realloc((b->d).var,(ulong)(uVar6 << 3));
    (b->d).var = pvVar5;
    (b->d).n_var = (uint)*(ushort *)&b->field_0x12;
  }
  (b->d).var_type = 0;
  if ((*(ushort *)&b->field_0x12 & 0xfffe) != 0) {
    ppcVar3 = (b->d).allele;
    pvVar5 = (b->d).var;
    pcVar4 = *ppcVar3;
    uVar7 = 1;
    do {
      pcVar14 = ppcVar3[uVar7];
      if ((pcVar4[1] == '\0') && (pcVar14[1] == '\0')) {
        cVar2 = *pcVar14;
        if (((cVar2 == '.') || (*pcVar4 == cVar2)) || (cVar2 == 'X')) {
LAB_00123235:
          pvVar5[uVar7].type = 0;
          pvVar5[uVar7].n = 0;
        }
        else {
LAB_00123295:
          pvVar5[uVar7].type = 1;
          pvVar5[uVar7].n = 1;
        }
      }
      else if (*pcVar14 == '<') {
        if ((pcVar14[1] == 'X') && (pcVar14[2] == '>')) goto LAB_00123235;
LAB_001230ef:
        pvVar5[uVar7].type = 8;
      }
      else {
        bVar18 = *pcVar4 == '\0';
        pcVar10 = pcVar4;
        pcVar15 = pcVar14;
        if ((!bVar18) && (pcVar13 = pcVar4 + 1, *pcVar4 == *pcVar14)) {
          do {
            pcVar10 = pcVar13;
            pcVar15 = pcVar15 + 1;
            bVar18 = *pcVar10 == '\0';
            if (bVar18) break;
            pcVar13 = pcVar10 + 1;
          } while (*pcVar10 == *pcVar15);
        }
        cVar2 = *pcVar15;
        iVar8 = (int)pcVar10;
        iVar9 = (int)pcVar15;
        if ((bVar18) && (cVar2 != '\0')) {
          iVar9 = ~(iVar8 + (int)pcVar14) + (int)pcVar4 + iVar9;
          do {
            iVar9 = iVar9 + 1;
            cVar2 = *pcVar15;
            pcVar15 = pcVar15 + 1;
          } while (cVar2 != '\0');
          pvVar5[uVar7].n = iVar9;
        }
        else if ((bool)(cVar2 != '\0' | bVar18)) {
          if ((cVar2 == '\0') && (bVar18)) goto LAB_00123235;
          pcVar14 = pcVar10 + -1;
          do {
            pcVar13 = pcVar14;
            pcVar14 = pcVar13 + 1;
          } while (pcVar13[2] != '\0');
          pcVar17 = pcVar15 + -1;
          do {
            pcVar16 = pcVar17;
            pcVar17 = pcVar16 + 1;
          } while (pcVar16[2] != '\0');
          if (((pcVar15 < pcVar17) && (pcVar10 < pcVar14)) && (*pcVar14 == *pcVar17)) {
            do {
              pcVar17 = pcVar16;
              pcVar14 = pcVar13;
              if ((pcVar17 <= pcVar15) || (pcVar14 <= pcVar10)) break;
              pcVar13 = pcVar14 + -1;
              pcVar16 = pcVar17 + -1;
            } while (*pcVar14 == *pcVar17);
          }
          lVar12 = (long)pcVar17 - (long)pcVar15;
          if (lVar12 == 0) {
            if (pcVar14 == pcVar10) goto LAB_00123295;
            pvVar5[uVar7].n = iVar8 - (int)pcVar14;
          }
          else {
            lVar11 = (long)pcVar14 - (long)pcVar10;
            if (lVar11 != 0) {
              iVar8 = 8;
              if (lVar11 == lVar12) {
                iVar8 = 2;
              }
              pvVar5[uVar7].type = iVar8;
              uVar6 = ~(uint)lVar11;
              if (lVar11 <= lVar12) {
                uVar6 = (int)lVar12 + 1;
              }
              pvVar5[uVar7].n = uVar6;
              goto LAB_00123268;
            }
            pvVar5[uVar7].n = (int)pcVar17 - iVar9;
          }
          if (*pcVar14 != *pcVar17) goto LAB_001230ef;
        }
        else {
          lVar12 = 0;
          do {
            pcVar15 = pcVar10 + lVar12;
            lVar12 = lVar12 + 1;
          } while (*pcVar15 != '\0');
          pvVar5[uVar7].n = (((iVar9 + (int)pcVar4) - (iVar8 + (int)pcVar14)) - (int)lVar12) + 1;
        }
        pvVar5[uVar7].type = 4;
      }
LAB_00123268:
      piVar1 = &(b->d).var_type;
      *piVar1 = *piVar1 | pvVar5[uVar7].type;
      uVar7 = uVar7 + 1;
    } while (uVar7 < *(ushort *)&b->field_0x12);
  }
  return;
}

Assistant:

static void bcf_set_variant_types(bcf1_t *b)
{
    if ( !(b->unpacked & BCF_UN_STR) ) bcf_unpack(b, BCF_UN_STR);
    bcf_dec_t *d = &b->d;
    if ( d->n_var < b->n_allele )
    {
        d->var = (variant_t *) realloc(d->var, sizeof(variant_t)*b->n_allele);
        d->n_var = b->n_allele;
    }
    int i;
    b->d.var_type = 0;
    for (i=1; i<b->n_allele; i++)
    {
        bcf_set_variant_type(d->allele[0],d->allele[i], &d->var[i]);
        b->d.var_type |= d->var[i].type;
        //fprintf(stderr,"[set_variant_type] %d   %s %s -> %d %d .. %d\n", b->pos+1,d->allele[0],d->allele[i],d->var[i].type,d->var[i].n, b->d.var_type);
    }
}